

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

int __thiscall
Player::executeAttack
          (Player *this,Country *fromCountry,Country *toCountry,Player *defendingPlayer,
          int numAttackingDice,int numDefendingDice)

{
  pointer *pppCVar1;
  pointer pcVar2;
  int *piVar3;
  pointer ppCVar4;
  string *psVar5;
  _Alloc_hider _Var6;
  vector<Map::Country*,std::allocator<Map::Country*>> *this_00;
  iterator __position;
  pointer ppCVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  GameLoop *pGVar11;
  PlayerState *pPVar12;
  int iVar13;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  vector<int,_std::allocator<int>_> defendingRolls;
  vector<int,_std::allocator<int>_> attackingRolls;
  long *local_c0;
  size_t local_b8;
  long local_b0 [2];
  Country *local_a0;
  Country *local_98;
  long *local_90;
  size_t local_88;
  long local_80 [2];
  Player *local_70;
  Player *local_68;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_a0 = toCountry;
  local_98 = fromCountry;
  DiceRoller::roll(&local_48,this->pDiceRoller,numAttackingDice);
  local_70 = defendingPlayer;
  DiceRoller::roll(&local_60,defendingPlayer->pDiceRoller,numDefendingDice);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  poVar10 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," - ",3);
  local_c0 = local_b0;
  pcVar2 = (local_98->cyName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + local_98->cyName->_M_string_length);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_c0,local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," is attacking ",0xe);
  local_90 = local_80;
  pcVar2 = (local_a0->cyName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + local_a0->cyName->_M_string_length);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_90,local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," - ",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_68 = this;
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  do {
    if ((local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start ==
         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) ||
       (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      if (this->currentState != (PlayerState *)0x0) {
        operator_delete(this->currentState,4);
      }
      pPVar12 = (PlayerState *)operator_new(4);
      *pPVar12 = IDLE;
      this->currentState = pPVar12;
      iVar8 = 1;
      break;
    }
    iVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish[-1];
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    iVar9 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish[-1];
    local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nAttacker rolled a ",0x13);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,". Defender rolled a ",0x14);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if (iVar9 < iVar8) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n[DEFENDER] Defender lost 1 army!",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      piVar3 = local_a0->pNumberOfTroops;
      *piVar3 = *piVar3 + -1;
      bVar19 = true;
      if (*piVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n[DEFENDER] Defender has lost possession of country ",
                   0x34);
        local_c0 = local_b0;
        pcVar2 = (local_a0->cyName->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,pcVar2,pcVar2 + local_a0->cyName->_M_string_length);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_c0,local_b8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
        *local_a0->pPlayerOwnerId = *this->pPlayerId;
        pvVar14 = local_70->pOwnedCountries;
        bVar19 = (pvVar14->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish !=
                 (pvVar14->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if (bVar19) {
          bVar19 = true;
          lVar18 = -8;
          lVar16 = 0;
          uVar17 = 0;
          do {
            ppCVar4 = (pvVar14->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(pvVar14->
                              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3) <=
                uVar17) {
LAB_00117c9f:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar17);
            }
            psVar5 = ppCVar4[uVar17]->cyName;
            local_c0 = local_b0;
            _Var6._M_p = (psVar5->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,_Var6._M_p,_Var6._M_p + psVar5->_M_string_length);
            local_90 = local_80;
            pcVar2 = (local_a0->cyName->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar2,pcVar2 + local_a0->cyName->_M_string_length);
            if (local_b8 == local_88) {
              if (local_b8 == 0) {
                bVar20 = true;
              }
              else {
                iVar8 = bcmp(local_c0,local_90,local_b8);
                bVar20 = iVar8 == 0;
              }
            }
            else {
              bVar20 = false;
            }
            if (local_90 != local_80) {
              operator_delete(local_90,local_80[0] + 1);
            }
            if (local_c0 != local_b0) {
              operator_delete(local_c0,local_b0[0] + 1);
            }
            this = local_68;
            pvVar14 = local_70->pOwnedCountries;
            ppCVar4 = (pvVar14->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar15 = (long)(pvVar14->
                           super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3;
            if (bVar20) {
              if (uVar15 <= uVar17) goto LAB_00117c9f;
              this_00 = (vector<Map::Country*,std::allocator<Map::Country*>> *)
                        local_68->pOwnedCountries;
              __position._M_current = *(Country ***)(this_00 + 8);
              if (__position._M_current == *(Country ***)(this_00 + 0x10)) {
                std::vector<Map::Country*,std::allocator<Map::Country*>>::
                _M_realloc_insert<Map::Country*const&>
                          (this_00,__position,(Country **)((long)ppCVar4 - lVar16));
              }
              else {
                *__position._M_current = ppCVar4[uVar17];
                *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
              }
              pvVar14 = local_70->pOwnedCountries;
              ppCVar4 = (pvVar14->
                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
                        .super__Vector_impl_data._M_start;
              ppCVar7 = (pvVar14->
                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl
                        .super__Vector_impl_data._M_finish;
              if ((pointer)((long)ppCVar4 - lVar18) != ppCVar7) {
                memmove(ppCVar4 + uVar17,ppCVar4 + uVar17 + 1,
                        (long)ppCVar7 + (lVar18 - (long)ppCVar4));
              }
              pppCVar1 = &(pvVar14->
                          super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppCVar1 = *pppCVar1 + -1;
              break;
            }
            uVar17 = uVar17 + 1;
            lVar18 = lVar18 + -8;
            lVar16 = lVar16 + -8;
            bVar19 = uVar17 < uVar15;
          } while (bVar19);
        }
        if (bVar19) {
          do {
            pGVar11 = GameLoop::getInstance();
            Deck::draw(pGVar11->gameDeck,this->pCards);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "\n[ATTACKER] How many armies do you want to place on your new country?(1 to "
                       ,0x4b);
            poVar10 = (ostream *)
                      std::ostream::operator<<(&std::cout,*local_98->pNumberOfTroops + -1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
            iVar9 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,4);
            iVar8 = *local_98->pNumberOfTroops;
            iVar13 = iVar8 - iVar9;
            if ((0 < iVar9 && (iVar13 != 0 && iVar9 <= iVar8)) &&
               (((byte)secure_getenv[*(long *)(std::cin + -0x18)] & 5) == 0)) {
              *local_98->pNumberOfTroops = iVar13;
              *local_a0->pNumberOfTroops = iVar9;
              break;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"\nInvalid number! Try again.",0x1b);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
            std::ostream::put(-0x80);
            std::ostream::flush();
          } while ((iVar9 < 1) || (*local_98->pNumberOfTroops <= iVar9));
          if (this->currentState != (PlayerState *)0x0) {
            operator_delete(this->currentState,4);
          }
          pPVar12 = (PlayerState *)operator_new(4);
          *pPVar12 = IDLE;
          this->currentState = pPVar12;
          defendingPlayer = (Player *)0x1;
        }
        else {
          if (this->currentState != (PlayerState *)0x0) {
            operator_delete(this->currentState,4);
          }
          pPVar12 = (PlayerState *)operator_new(4);
          *pPVar12 = IDLE;
          this->currentState = pPVar12;
          defendingPlayer = (Player *)0xffffffff;
        }
        bVar19 = false;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nAttacker lost 1 army!",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      *local_98->pNumberOfTroops = *local_98->pNumberOfTroops + -1;
      bVar19 = true;
    }
    iVar8 = (int)defendingPlayer;
  } while (bVar19);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar8;
}

Assistant:

int
Player::executeAttack(Map::Country *fromCountry, Map::Country *toCountry, Player *defendingPlayer, int numAttackingDice,
                      int numDefendingDice) {
    /*
     * 1. The attacking player rolls 1-3 dice, having +1 army than dice rolled. 1 dice roll per attacking army.
     * 2. Defender rolls 2 dice, 1 for each army defending
     * 3. Compare highest dice rolls per army, defender wins ties. lower number loses army
     * 4. If the defending country loses all its armies, the attacking country has to place
     * at least 1 of the attacking armies on the conquered country, up to all but one army
     */

    // Roll
    std::vector<int> attackingRolls = this->getDiceRoller()->roll(numAttackingDice);
    std::vector<int> defendingRolls = defendingPlayer->getDiceRoller()->roll(numDefendingDice);
    std::cout << std::endl << " - " << fromCountry->getCountryName() << " is attacking " << toCountry->getCountryName() << " - "<<std::endl;

    // Compare the rolls, decide who wins and change number of armies of each country. Maybe update if attacking wins
    while (!attackingRolls.empty() && !defendingRolls.empty()) {
        int aRoll = attackingRolls.back();
        int dRoll = defendingRolls.back();
        attackingRolls.pop_back();
        defendingRolls.pop_back();
        std::cout << "\nAttacker rolled a " << aRoll << ". Defender rolled a " << dRoll << "." << std::endl;
        if (aRoll > dRoll) {
            // defender loses 1 army
            std::cout << "\n[DEFENDER] Defender lost 1 army!" << std::endl;
            toCountry->setNumberOfTroops(toCountry->getNumberOfTroops() - 1);
            // then, if no armies left on defending country, attacking player conquers it
            if (toCountry->getNumberOfTroops() == 0) {
                std::cout << "\n[DEFENDER] Defender has lost possession of country " << toCountry->getCountryName()
                          << std::endl;
                if (!exchangeCountryOwnership(*this, defendingPlayer, *toCountry)) {
                    this->setPlayerState(PlayerState::IDLE);
                    return PlayerAction::FAILED;
                } else {
                    int newArmies = 0;
                    do {
                        GameLoop::getInstance()->getGameDeck()->draw(*this->getCards());
                        cout << "\n[ATTACKER] How many armies do you want to place on your new country?(1 to "
                             << fromCountry->getNumberOfTroops() - 1 << ")";
                        newArmies = strategy->intInput(StrategyContext::ATTACK_NEW_ARMY_COUNT);
                        if (newArmies > fromCountry->getNumberOfTroops() - 1 || newArmies < 1 || cin.fail() || isnan(newArmies)) {
                            cout << "\nInvalid number! Try again." << std::endl;
                            continue;
                        } else {
                            fromCountry->setNumberOfTroops(fromCountry->getNumberOfTroops() - newArmies);
                            toCountry->setNumberOfTroops(newArmies);
                            break;
                        }
                    } while (newArmies > fromCountry->getNumberOfTroops() - 1 || newArmies < 1);
                    this->setPlayerState(PlayerState::IDLE);
                    return PlayerAction::SUCCEEDED;
                }
            }
        } else {
            // attacker loses 1 army
            std::cout << "\nAttacker lost 1 army!" << std::endl;
            fromCountry->setNumberOfTroops(fromCountry->getNumberOfTroops() - 1);
        }
    }
    this->setPlayerState(PlayerState::IDLE);
    return PlayerAction::SUCCEEDED;
}